

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::
basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
::create<std::__cxx11::string,char_const(&)[1]>(char (*args) [1])

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pbVar3;
  undefined1 local_30 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
  object;
  anon_class_8_1_a7a39255_for__M_head_impl deleter;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> alloc;
  char (*args_local) [1];
  
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&deleter.alloc + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pbVar2);
  object._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = pbVar2;
  pbVar2 = __gnu_cxx::
           new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::allocate((new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pbVar2,1,(void *)0x0);
  std::
  unique_ptr<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>::create<std::__cxx11::string,char_const(&)[1]>(char_const(&)[1])::{lambda(std::__cxx11::string*)#1}>
  ::
  unique_ptr<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>::create<std::__cxx11::string,char_const(&)[1]>(char_const(&)[1])::_lambda(std::__cxx11::string*)_1_,void>
            ((unique_ptr<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>::create<std::__cxx11::string,char_const(&)[1]>(char_const(&)[1])::_lambda(std::__cxx11::string*)_1_>
              *)local_30,pbVar2,
             (deleter_type *)
             &object._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            );
  pbVar3 = std::
           unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp:1628:24)>
           ::get((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
                  *)local_30);
  __gnu_cxx::new_allocator<std::__cxx11::string>::construct<std::__cxx11::string,char_const(&)[1]>
            ((new_allocator<std::__cxx11::string> *)((long)&deleter.alloc + 7),pbVar3,args);
  bVar1 = std::operator!=((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
                           *)local_30,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp"
                  ,0x662,
                  "static T *nlohmann::basic_json<>::create(Args &&...) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, T = std::basic_string<char>, Args = <const char (&)[1]>]"
                 );
  }
  pbVar3 = std::
           unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp:1628:24)>
           ::release((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
                      *)local_30);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp:1628:24)>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_NikitaEvs[P]WildHack_thirdparty_json_json_hpp:1628:24)>
                 *)local_30);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&deleter.alloc + 7));
  return pbVar3;
}

Assistant:

static T* create(Args&& ... args)
    {
        AllocatorType<T> alloc;
        auto deleter = [&](T * object)
        {
            alloc.deallocate(object, 1);
        };
        std::unique_ptr<T, decltype(deleter)> object(alloc.allocate(1), deleter);
        alloc.construct(object.get(), std::forward<Args>(args)...);
        assert(object != nullptr);
        return object.release();
    }